

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dog.c
# Opt level: O0

void keepdogs(int exclude,char *pet_msg_suffix)

{
  monst *pmVar1;
  bool bVar2;
  boolean bVar3;
  byte bVar4;
  xchar tolev;
  int iVar5;
  char *pcVar6;
  int local_4c;
  int cnt;
  boolean pets_only;
  boolean stay_behind;
  obj *poStack_30;
  int num_segs;
  obj *obj;
  monst *mtmp2;
  monst *mtmp;
  char *pet_msg_suffix_local;
  int exclude_local;
  
  pmVar1 = level->monlist;
  mtmp = (monst *)pet_msg_suffix;
  do {
    while( true ) {
      do {
        mtmp2 = pmVar1;
        if (mtmp2 == (monst *)0x0) {
          return;
        }
        pmVar1 = mtmp2->nmon;
      } while ((mtmp2->mhp < 1) || ((exclude == 1 && (mtmp2->mtame == '\0'))));
      bVar3 = monnear(mtmp2,(int)u.ux,(int)u.uy);
      if (((((bVar3 != '\0') && (bVar3 = levl_follower(mtmp2), bVar3 != '\0')) ||
           ((mtmp2 == u.usteed ||
            (((u.uhave._0_1_ & 1) != 0 && ((*(uint *)&mtmp2->field_0x60 >> 0x1d & 1) != 0)))))) &&
          ((((*(uint *)&mtmp2->field_0x60 >> 0x13 & 1) == 0 &&
            ((*(uint *)&mtmp2->field_0x60 >> 0x12 & 1) != 0)) || (mtmp2 == u.usteed)))) &&
         ((mtmp2->mstrategy & 0x20000000U) == 0)) break;
      if ((*(uint *)&mtmp2->field_0x60 >> 0x1d & 1) == 0) {
        if ((*(uint *)&mtmp2->field_0x60 >> 0x18 & 1) != 0) {
          pcVar6 = Monnam(mtmp2);
          s_suffix(pcVar6);
          pline("%s leash goes slack.");
          m_unleash(mtmp2,'\0');
        }
      }
      else {
        tolev = ledger_no(&u.uz);
        migrate_to_level(mtmp2,tolev,'\x02',(coord *)0x0);
      }
    }
    bVar2 = false;
    if ((mtmp2->mtame == '\0') || (mtmp2->meating == 0)) {
      if ((mtmp2->mtame == '\0') || (exclude != 2)) {
        iVar5 = mon_has_amulet(mtmp2);
        if (iVar5 == 0) {
          if ((mtmp2->mtame != '\0') && ((*(uint *)&mtmp2->field_0x60 >> 0x17 & 1) != 0)) {
            if (mtmp2->wormno == '\0') {
              if ((viz_array[mtmp2->my][mtmp2->mx] & 2U) != 0) goto LAB_00198ea8;
              if (((((u.uprops[0x1e].intrinsic == 0) &&
                    (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                     (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                   ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                  ((u.uprops[0x40].intrinsic != 0 ||
                   ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0))))))
                 && ((mtmp2->data->mflags3 & 0x200) != 0)) {
                bVar4 = viz_array[mtmp2->my][mtmp2->mx] & 1;
                goto joined_r0x00198ea2;
              }
            }
            else {
              bVar4 = worm_known(level,mtmp2);
joined_r0x00198ea2:
              if (bVar4 != 0) {
LAB_00198ea8:
                if (((((((*(uint *)&mtmp2->field_0x60 >> 1 & 1) == 0) ||
                       (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) ||
                     (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
                    (((*(uint *)&mtmp2->field_0x60 >> 7 & 1) == 0 &&
                     ((*(uint *)&mtmp2->field_0x60 >> 9 & 1) == 0)))) &&
                   (((byte)u._1052_1_ >> 5 & 1) == 0)) {
                  pcVar6 = Monnam(mtmp2);
                  pline("%s is still trapped.",pcVar6);
                }
              }
            }
            bVar2 = true;
          }
        }
        else {
          if (mtmp2->wormno == '\0') {
            if ((viz_array[mtmp2->my][mtmp2->mx] & 2U) != 0) goto LAB_00198c79;
            if (((((u.uprops[0x1e].intrinsic == 0) &&
                  ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                 (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
               (((u.uprops[0x40].intrinsic != 0 ||
                 ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
                ((mtmp2->data->mflags3 & 0x200) != 0)))) {
              bVar4 = viz_array[mtmp2->my][mtmp2->mx] & 1;
              goto joined_r0x00198c73;
            }
          }
          else {
            bVar4 = worm_known(level,mtmp2);
joined_r0x00198c73:
            if (bVar4 != 0) {
LAB_00198c79:
              if ((((((*(uint *)&mtmp2->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)
                    ) || (u.uprops[0xc].extrinsic != 0)) ||
                  (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
                 ((((*(uint *)&mtmp2->field_0x60 >> 7 & 1) == 0 &&
                   ((*(uint *)&mtmp2->field_0x60 >> 9 & 1) == 0)) &&
                  (((byte)u._1052_1_ >> 5 & 1) == 0)))) {
                pcVar6 = Monnam(mtmp2);
                pline("%s seems very disoriented for a moment.",pcVar6);
              }
            }
          }
          bVar2 = true;
        }
      }
      else {
        if (mtmp == (monst *)0x0) {
          mtmp = (monst *)anon_var_dwarf_2017e;
        }
        pcVar6 = Monnam(mtmp2);
        pline("%s %s",pcVar6,mtmp);
        bVar2 = true;
      }
    }
    else {
      if (mtmp2->wormno == '\0') {
        if ((viz_array[mtmp2->my][mtmp2->mx] & 2U) != 0) goto LAB_00198a13;
        if (((((u.uprops[0x1e].intrinsic == 0) &&
              ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
            ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
           (((u.uprops[0x40].intrinsic != 0 ||
             ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
            ((mtmp2->data->mflags3 & 0x200) != 0)))) {
          bVar4 = viz_array[mtmp2->my][mtmp2->mx] & 1;
          goto joined_r0x00198a0d;
        }
      }
      else {
        bVar4 = worm_known(level,mtmp2);
joined_r0x00198a0d:
        if (bVar4 != 0) {
LAB_00198a13:
          if ((((((*(uint *)&mtmp2->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
             ((((*(uint *)&mtmp2->field_0x60 >> 7 & 1) == 0 &&
               ((*(uint *)&mtmp2->field_0x60 >> 9 & 1) == 0)) && (((byte)u._1052_1_ >> 5 & 1) == 0))
             )) {
            pcVar6 = Monnam(mtmp2);
            pline("%s is still eating.",pcVar6);
          }
        }
      }
      bVar2 = true;
    }
    if (mtmp2 == u.usteed) {
      bVar2 = false;
    }
    if (bVar2) {
      if ((*(uint *)&mtmp2->field_0x60 >> 0x18 & 1) != 0) {
        pline("%s leash suddenly comes loose.");
        m_unleash(mtmp2,'\0');
      }
    }
    else {
      if ((*(uint *)&mtmp2->field_0x60 >> 0x19 & 1) != 0) {
        set_residency(mtmp2,'\x01');
      }
      if (mtmp2->wormno == '\0') {
        cnt._0_1_ = '\0';
      }
      else {
        local_4c = count_wsegs(mtmp2);
        if (0x1e < local_4c) {
          local_4c = 0x1f;
        }
        cnt._0_1_ = (uchar)local_4c;
        wormgone(mtmp2);
      }
      for (poStack_30 = mtmp2->minvent; poStack_30 != (obj *)0x0; poStack_30 = poStack_30->nobj) {
        if (poStack_30->cobj != (obj *)0x0) {
          picked_container(poStack_30);
        }
        *(uint *)&poStack_30->field_0x4a = *(uint *)&poStack_30->field_0x4a & 0xfffffff7;
      }
      relmon(mtmp2);
      newsym((int)mtmp2->mx,(int)mtmp2->my);
      mtmp2->my = '\0';
      mtmp2->mx = '\0';
      mtmp2->wormno = (uchar)cnt;
      mtmp2->mlstmv = moves;
      mtmp2->nmon = mydogs;
      mydogs = mtmp2;
    }
  } while( true );
}

Assistant:

void keepdogs(int exclude, const char *pet_msg_suffix)
{
	struct monst *mtmp, *mtmp2;
	struct obj *obj;
	int num_segs;
	boolean stay_behind;
	boolean pets_only = (exclude == 1) ? TRUE : FALSE;

	for (mtmp = level->monlist; mtmp; mtmp = mtmp2) {
	    mtmp2 = mtmp->nmon;
	    if (DEADMONSTER(mtmp)) continue;
	    if (pets_only && !mtmp->mtame) continue;
	    if (((monnear(mtmp, u.ux, u.uy) && levl_follower(mtmp)) ||
			(mtmp == u.usteed) ||
		/* the wiz will level t-port from anywhere to chase
		   the amulet; if you don't have it, will chase you
		   only if in range. -3. */
			(u.uhave.amulet && mtmp->iswiz))
		&& ((!mtmp->msleeping && mtmp->mcanmove)
		    /* eg if level teleport or new trap, steed has no control
		       to avoid following */
		    || (mtmp == u.usteed))
		/* monster won't follow if it hasn't noticed you yet */
		&& !(mtmp->mstrategy & STRAT_WAITFORU)) {
		stay_behind = FALSE;
		if (mtmp->mtame && mtmp->meating) {
			if (canseemon(level, mtmp))
			    pline("%s is still eating.", Monnam(mtmp));
			stay_behind = TRUE;
		} else if (mtmp->mtame && exclude == 2) {
			if (pet_msg_suffix == NULL)
			    pet_msg_suffix = "remains behind.";
			pline("%s %s", Monnam(mtmp), pet_msg_suffix);
			stay_behind = TRUE;
		} else if (mon_has_amulet(mtmp)) {
			if (canseemon(level, mtmp))
			    pline("%s seems very disoriented for a moment.",
				Monnam(mtmp));
			stay_behind = TRUE;
		} else if (mtmp->mtame && mtmp->mtrapped) {
			if (canseemon(level, mtmp))
			    pline("%s is still trapped.", Monnam(mtmp));
			stay_behind = TRUE;
		}
		if (mtmp == u.usteed)
			stay_behind = FALSE;
		
		if (stay_behind) {
			if (mtmp->mleashed) {
				pline("%s leash suddenly comes loose.",
					humanoid(mtmp->data)
					    ? (mtmp->female ? "Her" : "His")
					    : "Its");
				m_unleash(mtmp, FALSE);
			}
			continue;
		}
		if (mtmp->isshk)
			set_residency(mtmp, TRUE);

		if (mtmp->wormno) {
		    int cnt;
		    /* NOTE: worm is truncated to # segs = max wormno size */
		    cnt = count_wsegs(mtmp);
		    num_segs = min(cnt, MAX_NUM_WORMS - 1);
		    wormgone(mtmp);
		} else num_segs = 0;

		/* set minvent's obj->no_charge to 0 */
		for (obj = mtmp->minvent; obj; obj = obj->nobj) {
		    if (Has_contents(obj))
			picked_container(obj);	/* does the right thing */
		    obj->no_charge = 0;
		}

		relmon(mtmp);
		newsym(mtmp->mx,mtmp->my);
		mtmp->mx = mtmp->my = 0; /* avoid mnexto()/MON_AT() problem */
		mtmp->wormno = num_segs;
		mtmp->mlstmv = moves;
		mtmp->nmon = mydogs;
		mydogs = mtmp;
	    } else if (mtmp->iswiz) {
		/* we want to be able to find him when his next resurrection
		   chance comes up, but have him resume his present location
		   if player returns to this level before that time */
		migrate_to_level(mtmp, ledger_no(&u.uz),
				 MIGR_EXACT_XY, NULL);
	    } else if (mtmp->mleashed) {
		/* this can happen if your quest leader ejects you from the
		   "home" level while a leashed pet isn't next to you */
		pline("%s leash goes slack.", s_suffix(Monnam(mtmp)));
		m_unleash(mtmp, FALSE);
	    }
	}
}